

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O3

QList<QTzTransition> *
parseTzTransitions(QList<QTzTransition> *__return_storage_ptr__,QDataStream *ds,int tzh_timecnt,
                  bool longTran)

{
  quint8 qVar1;
  Status SVar2;
  pointer pQVar3;
  undefined7 in_register_00000009;
  long lVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  quint8 typeind;
  qint32 val;
  quint8 local_3d;
  qint32 local_3c;
  QList<QTzTransition> *local_38;
  
  local_38 = *(QList<QTzTransition> **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (QTzTransition *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QTzTransition>::QList(__return_storage_ptr__,(long)tzh_timecnt);
  if ((int)CONCAT71(in_register_00000009,longTran) == 0) {
    local_3c = -0x55555556;
    if (0 < tzh_timecnt) {
      uVar5 = 0;
      do {
        SVar2 = QDataStream::status(ds);
        if (SVar2 != Ok) break;
        QDataStream::operator>>(ds,&local_3c);
        lVar4 = (long)local_3c;
        pQVar3 = QList<QTzTransition>::data(__return_storage_ptr__);
        pQVar3[uVar5].tz_time = lVar4;
        SVar2 = QDataStream::status(ds);
        if (SVar2 != Ok) {
          QList<QTzTransition>::resize(__return_storage_ptr__,uVar5);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != (uint)tzh_timecnt);
    }
  }
  else {
    if (tzh_timecnt < 1) goto LAB_003fc360;
    uVar5 = 0;
    do {
      SVar2 = QDataStream::status(ds);
      if (SVar2 != Ok) break;
      pQVar3 = QList<QTzTransition>::data(__return_storage_ptr__);
      QDataStream::operator>>(ds,&pQVar3[uVar5].tz_time);
      SVar2 = QDataStream::status(ds);
      if (SVar2 != Ok) {
        QList<QTzTransition>::resize(__return_storage_ptr__,uVar5);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)tzh_timecnt);
  }
  if (0 < tzh_timecnt) {
    lVar4 = 0;
    do {
      SVar2 = QDataStream::status(ds);
      if (SVar2 != Ok) break;
      local_3d = 0xaa;
      QDataStream::operator>>(ds,(qint8 *)&local_3d);
      SVar2 = QDataStream::status(ds);
      qVar1 = local_3d;
      if (SVar2 == Ok) {
        pQVar3 = QList<QTzTransition>::data(__return_storage_ptr__);
        (&pQVar3->tz_typeind)[lVar4] = qVar1;
      }
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(uint)tzh_timecnt << 4 != lVar4);
  }
LAB_003fc360:
  if (*(QList<QTzTransition> **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(QList<QTzTransition> **)(in_FS_OFFSET + 0x28);
}

Assistant:

static QList<QTzTransition> parseTzTransitions(QDataStream &ds, int tzh_timecnt, bool longTran)
{
    QList<QTzTransition> transitions(tzh_timecnt);

    if (longTran) {
        // Parse tzh_timecnt x 8-byte transition times
        for (int i = 0; i < tzh_timecnt && ds.status() == QDataStream::Ok; ++i) {
            ds >> transitions[i].tz_time;
            if (ds.status() != QDataStream::Ok)
                transitions.resize(i);
        }
    } else {
        // Parse tzh_timecnt x 4-byte transition times
        qint32 val;
        for (int i = 0; i < tzh_timecnt && ds.status() == QDataStream::Ok; ++i) {
            ds >> val;
            transitions[i].tz_time = val;
            if (ds.status() != QDataStream::Ok)
                transitions.resize(i);
        }
    }

    // Parse tzh_timecnt x 1-byte transition type index
    for (int i = 0; i < tzh_timecnt && ds.status() == QDataStream::Ok; ++i) {
        quint8 typeind;
        ds >> typeind;
        if (ds.status() == QDataStream::Ok)
            transitions[i].tz_typeind = typeind;
    }

    return transitions;
}